

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O1

DP_WS_Stream
EvpathInitWriter(CP_Services Svcs,void *CP_Stream,_SstParams *Params,attr_list DPAttrs,
                SstStats Stats)

{
  undefined8 *puVar1;
  CManager p_Var2;
  SMPI_Comm comm;
  undefined8 uVar3;
  
  puVar1 = (undefined8 *)malloc(0x70);
  p_Var2 = (*Svcs->getCManager)(CP_Stream);
  comm = (*Svcs->getMPIComm)(CP_Stream);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[8] = 0;
  puVar1[9] = 0;
  puVar1[10] = 0;
  puVar1[0xb] = 0;
  puVar1[0xc] = 0;
  puVar1[0xd] = 0;
  pthread_mutex_init((pthread_mutex_t *)(puVar1 + 3),(pthread_mutexattr_t *)0x0);
  SMPI_Comm_rank(comm,(int *)(puVar1 + 2));
  puVar1[1] = CP_Stream;
  puVar1[0xd] = Stats;
  uVar3 = CMregister_format(p_Var2,EvpathReadRequestStructs);
  CMregister_handler(uVar3,EvpathReadRequestHandler,Svcs);
  uVar3 = CMregister_format(p_Var2,EvpathPreloadStructs);
  puVar1[10] = uVar3;
  uVar3 = CMregister_format(p_Var2,EvpathReadReplyStructs);
  puVar1[9] = uVar3;
  return puVar1;
}

Assistant:

static DP_WS_Stream EvpathInitWriter(CP_Services Svcs, void *CP_Stream, struct _SstParams *Params,
                                     attr_list DPAttrs, SstStats Stats)
{
    Evpath_WS_Stream Stream = malloc(sizeof(struct _Evpath_WS_Stream));
    CManager cm = Svcs->getCManager(CP_Stream);
    SMPI_Comm comm = Svcs->getMPIComm(CP_Stream);
    CMFormat F;

    memset(Stream, 0, sizeof(struct _Evpath_WS_Stream));

    pthread_mutex_init(&Stream->DataLock, NULL);

    SMPI_Comm_rank(comm, &Stream->Rank);

    /*
     * save the CP_stream value of later use
     */
    Stream->CP_Stream = CP_Stream;
    Stream->Stats = Stats;

    /*
     * add a handler for read request messages
     */
    F = CMregister_format(cm, EvpathReadRequestStructs);
    CMregister_handler(F, EvpathReadRequestHandler, Svcs);

    /*
     * Register for sending preload messages
     */
    Stream->PreloadFormat = CMregister_format(cm, EvpathPreloadStructs);
    /*
     * register read reply message structure so we can send later
     */
    Stream->ReadReplyFormat = CMregister_format(cm, EvpathReadReplyStructs);

    //   We'd set an attribute here if we needed to communicate it to possible
    //   readers
    //    set_int_attr(DPAttrs, attr_atom_from_string("EVPATH_DP_Attr"),
    //    0xdeadbeef);

    return (void *)Stream;
}